

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,bool&,char_const(&)[19],long_long&,long_long&,long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,bool *params,
          char (*params_1) [19],longlong *params_2,longlong *params_3,longlong *params_4)

{
  undefined4 in_register_00000014;
  char (*params_00) [19];
  longlong *params_01;
  longlong *params_02;
  longlong *params_03;
  long lVar1;
  String argValues [5];
  
  this->exception = (Exception *)0x0;
  str<bool&>(argValues,(kj *)params,(bool *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[19]>(argValues + 1,(kj *)params_1,params_00);
  str<long_long&>(argValues + 2,(kj *)params_2,params_01);
  str<long_long&>(argValues + 3,(kj *)params_3,params_02);
  str<long_long&>(argValues + 4,(kj *)params_4,params_03);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x60;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}